

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

basic_node_ptr<unodb::detail::olc_node_header> __thiscall
unodb::detail::
olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::leave_last_child(olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                   *this,uint8_t child_to_delete,db_type *db_instance)

{
  bool bVar1;
  optimistic_lock *poVar2;
  reference this_00;
  basic_node_ptr<unodb::detail::olc_node_header> bVar3;
  olc_node_ptr local_30;
  db_type *local_28;
  db_type *db_instance_local;
  olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *poStack_18;
  uint8_t child_to_delete_local;
  olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  
  local_28 = db_instance;
  db_instance_local._7_1_ = child_to_delete;
  poStack_18 = this;
  poVar2 = lock<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                     (this);
  bVar1 = optimistic_lock::is_obsoleted_by_this_thread(poVar2);
  if (!bVar1) {
    __assert_fail("lock(*this).is_obsoleted_by_this_thread()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x45d,
                  "auto unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>::leave_last_child(std::uint8_t, db_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  this_00 = std::
            array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
            ::operator[](&(this->
                          super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                          ).children,(ulong)db_instance_local._7_1_);
  local_30.tagged_ptr =
       (uintptr_t)
       in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::load
                 (this_00);
  poVar2 = node_ptr_lock(&local_30);
  bVar1 = optimistic_lock::is_obsoleted_by_this_thread(poVar2);
  if (!bVar1) {
    __assert_fail("node_ptr_lock(this->children[child_to_delete].load()) .is_obsoleted_by_this_thread()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0x45f,
                  "auto unodb::detail::olc_inode_4<std::span<const std::byte>, std::span<const std::byte>>::leave_last_child(std::uint8_t, db_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  bVar3 = basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
          ::leave_last_child(&this->
                              super_olc_inode_4_parent<std::span<const_std::byte>,_std::span<const_std::byte>_>
                             ,db_instance_local._7_1_,local_28);
  return (basic_node_ptr<unodb::detail::olc_node_header>)bVar3.tagged_ptr;
}

Assistant:

[[nodiscard]] auto leave_last_child(std::uint8_t child_to_delete,
                                      db_type& db_instance) noexcept {
    UNODB_DETAIL_ASSERT(lock(*this).is_obsoleted_by_this_thread());
    UNODB_DETAIL_ASSERT(node_ptr_lock(this->children[child_to_delete].load())
                            .is_obsoleted_by_this_thread());

    return parent_class::leave_last_child(child_to_delete, db_instance);
  }